

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_matrix.c
# Opt level: O0

int gdAffineFlip(double *dst,double *src,int flip_h,int flip_v)

{
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  int flip_v_local;
  int flip_h_local;
  double *src_local;
  double *dst_local;
  
  if (flip_h == 0) {
    local_28 = *src;
  }
  else {
    local_28 = -*src;
  }
  *dst = local_28;
  if (flip_h == 0) {
    local_30 = src[1];
  }
  else {
    local_30 = -src[1];
  }
  dst[1] = local_30;
  if (flip_v == 0) {
    local_38 = src[2];
  }
  else {
    local_38 = -src[2];
  }
  dst[2] = local_38;
  if (flip_v == 0) {
    local_40 = src[3];
  }
  else {
    local_40 = -src[3];
  }
  dst[3] = local_40;
  if (flip_h == 0) {
    local_48 = src[4];
  }
  else {
    local_48 = -src[4];
  }
  dst[4] = local_48;
  if (flip_v == 0) {
    local_50 = src[5];
  }
  else {
    local_50 = -src[5];
  }
  dst[5] = local_50;
  return 1;
}

Assistant:

BGD_DECLARE(int) gdAffineFlip (double dst[6], const double src[6], const int flip_h, const int flip_v)
{
	dst[0] = flip_h ? - src[0] : src[0];
	dst[1] = flip_h ? - src[1] : src[1];
	dst[2] = flip_v ? - src[2] : src[2];
	dst[3] = flip_v ? - src[3] : src[3];
	dst[4] = flip_h ? - src[4] : src[4];
	dst[5] = flip_v ? - src[5] : src[5];
	return GD_TRUE;
}